

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compile.cc
# Opt level: O2

int __thiscall re2::Compiler::AddSuffixRecursive(Compiler *this,int root,int id)

{
  Inst *pIVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  Frag FVar5;
  uint uVar6;
  uint32_t uVar7;
  uint uVar8;
  ulong uVar9;
  
  FVar5 = FindByteRange(this,root,id);
  uVar7 = FVar5.begin;
  if (uVar7 == 0) {
    uVar8 = AllocInst(this,1);
    if (-1 < (int)uVar8) {
      Prog::Inst::InitAlt((this->inst_).ptr_._M_t.
                          super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                          ._M_t.
                          super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                          .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + uVar8,root
                          ,id);
      return uVar8;
    }
  }
  else {
    uVar9 = (ulong)FVar5 >> 0x20;
    uVar8 = root;
    if (uVar9 != 0) {
      pIVar1 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
      if ((uVar9 & 1) == 0) {
        uVar8 = pIVar1[(int)uVar7].out_opcode_ >> 4;
      }
      else {
        uVar8 = pIVar1[(int)uVar7].field_1.cap_;
      }
    }
    bVar2 = IsCachedRuneByteSuffix(this,uVar8);
    uVar3 = uVar8;
    uVar6 = root;
    if (bVar2) {
      uVar3 = AllocInst(this,1);
      if ((int)uVar3 < 0) {
        return 0;
      }
      pIVar1 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
      Prog::Inst::InitByteRange
                (pIVar1 + uVar3,(uint)pIVar1[(int)uVar8].field_1.field_3.lo_,
                 (uint)pIVar1[(int)uVar8].field_1.field_3.hi_,
                 pIVar1[(int)uVar8].field_1.field_3.hint_foldcase_ & 1,
                 pIVar1[(int)uVar8].out_opcode_ >> 4);
      uVar6 = uVar3;
      if (uVar9 != 0) {
        pIVar1 = (this->inst_).ptr_._M_t.
                 super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 _M_t.
                 super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
                 super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
        if ((uVar9 & 1) == 0) {
          pIVar1[(int)uVar7].out_opcode_ = pIVar1[(int)uVar7].out_opcode_ & 0xf | uVar3 << 4;
          uVar6 = root;
        }
        else {
          pIVar1[(int)uVar7].field_1.cap_ = uVar3;
          uVar6 = root;
        }
      }
    }
    uVar8 = (this->inst_).ptr_._M_t.
            super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
            super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
            super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl[id].out_opcode_;
    bVar2 = IsCachedRuneByteSuffix(this,id);
    if (!bVar2) {
      pIVar1 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl + id;
      pIVar1->out_opcode_ = 0;
      pIVar1->field_1 = (anon_union_4_5_a3ff96c3_for_Inst_2)0x0;
      this->ninst_ = this->ninst_ + -1;
    }
    iVar4 = AddSuffixRecursive(this,(this->inst_).ptr_._M_t.
                                    super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>
                                    .super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl
                                    [(int)uVar3].out_opcode_ >> 4,uVar8 >> 4);
    if (iVar4 != 0) {
      pIVar1 = (this->inst_).ptr_._M_t.
               super___uniq_ptr_impl<re2::Prog::Inst,_re2::PODArray<re2::Prog::Inst>::Deleter>._M_t.
               super__Tuple_impl<0UL,_re2::Prog::Inst_*,_re2::PODArray<re2::Prog::Inst>::Deleter>.
               super__Head_base<0UL,_re2::Prog::Inst_*,_false>._M_head_impl;
      pIVar1[(int)uVar3].out_opcode_ = pIVar1[(int)uVar3].out_opcode_ & 0xf | iVar4 << 4;
      return uVar6;
    }
  }
  return 0;
}

Assistant:

int Compiler::AddSuffixRecursive(int root, int id) {
  DCHECK(inst_[root].opcode() == kInstAlt ||
         inst_[root].opcode() == kInstByteRange);

  Frag f = FindByteRange(root, id);
  if (IsNoMatch(f)) {
    int alt = AllocInst(1);
    if (alt < 0)
      return 0;
    inst_[alt].InitAlt(root, id);
    return alt;
  }

  int br;
  if (f.end.p == 0)
    br = root;
  else if (f.end.p&1)
    br = inst_[f.begin].out1();
  else
    br = inst_[f.begin].out();

  if (IsCachedRuneByteSuffix(br)) {
    // We can't fiddle with cached suffixes, so make a clone of the head.
    int byterange = AllocInst(1);
    if (byterange < 0)
      return 0;
    inst_[byterange].InitByteRange(inst_[br].lo(), inst_[br].hi(),
                                   inst_[br].foldcase(), inst_[br].out());

    // Ensure that the parent points to the clone, not to the original.
    // Note that this could leave the head unreachable except via the cache.
    br = byterange;
    if (f.end.p == 0)
      root = br;
    else if (f.end.p&1)
      inst_[f.begin].out1_ = br;
    else
      inst_[f.begin].set_out(br);
  }

  int out = inst_[id].out();
  if (!IsCachedRuneByteSuffix(id)) {
    // The head should be the instruction most recently allocated, so free it
    // instead of leaving it unreachable.
    DCHECK_EQ(id, ninst_-1);
    inst_[id].out_opcode_ = 0;
    inst_[id].out1_ = 0;
    ninst_--;
  }

  out = AddSuffixRecursive(inst_[br].out(), out);
  if (out == 0)
    return 0;

  inst_[br].set_out(out);
  return root;
}